

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * __thiscall
chaiscript::AST_Node::to_string(string *__return_storage_ptr__,AST_Node *this,string *t_prepend)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  AST_Node *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  reference local_1e0;
  reference_wrapper<chaiscript::AST_Node> *elem;
  iterator __end2;
  iterator __begin2;
  vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  *__range2;
  ostringstream local_198 [8];
  ostringstream oss;
  string *t_prepend_local;
  AST_Node *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,(string *)t_prepend);
  poVar2 = std::operator<<(poVar2,"(");
  pcVar3 = anon_unknown_430::ast_node_type_to_string(this->identifier);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,") ");
  poVar2 = std::operator<<(poVar2,(string *)&this->text);
  poVar2 = std::operator<<(poVar2," : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->location).start.line);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->location).start.column);
  std::operator<<(poVar2,'\n');
  (**this->_vptr_AST_Node)(&__begin2);
  __end2 = std::
           vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
           ::begin((vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
                    *)&__begin2);
  elem = (reference_wrapper<chaiscript::AST_Node> *)
         std::
         vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
         ::end((vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
                *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
                      (&__end2,(__normal_iterator<std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
                                *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_1e0 = __gnu_cxx::
                __normal_iterator<std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
                ::operator*(&__end2);
    this_00 = std::reference_wrapper<chaiscript::AST_Node>::get(local_1e0);
    std::operator+(&local_220,t_prepend,"  ");
    to_string(&local_200,this_00,&local_220);
    std::operator<<((ostream *)local_198,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  ::~vector((vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
             *)&__begin2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const std::string &t_prepend = "") const {
      std::ostringstream oss;

      oss << t_prepend << "(" << ast_node_type_to_string(this->identifier) << ") " << this->text << " : " << this->location.start.line
          << ", " << this->location.start.column << '\n';

      for (auto &elem : get_children()) {
        oss << elem.get().to_string(t_prepend + "  ");
      }
      return oss.str();
    }